

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmmath.c
# Opt level: O2

double lj_vm_foldfpm(double x,int fpm)

{
  double dVar1;
  
  switch(fpm) {
  case 0:
    dVar1 = (double)lj_vm_floor();
    return dVar1;
  case 1:
    dVar1 = (double)lj_vm_ceil();
    return dVar1;
  case 2:
    dVar1 = (double)lj_vm_trunc();
    return dVar1;
  case 3:
    break;
  case 4:
    dVar1 = log(x);
    return dVar1;
  case 5:
    dVar1 = log2(x);
    return dVar1;
  default:
    return 0.0;
  }
  if (x < 0.0) {
    dVar1 = sqrt(x);
    return dVar1;
  }
  return SQRT(x);
}

Assistant:

double lj_vm_foldfpm(double x, int fpm)
{
  switch (fpm) {
  case IRFPM_FLOOR: return lj_vm_floor(x);
  case IRFPM_CEIL: return lj_vm_ceil(x);
  case IRFPM_TRUNC: return lj_vm_trunc(x);
  case IRFPM_SQRT: return sqrt(x);
  case IRFPM_LOG: return log(x);
  case IRFPM_LOG2: return lj_vm_log2(x);
  default: lj_assertX(0, "bad fpm %d", fpm);
  }
  return 0;
}